

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O2

void __thiscall Spc_Dsp::run(Spc_Dsp *this,int clock_count)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  byte bVar7;
  uint uVar8;
  uint8_t *puVar9;
  int *piVar10;
  sample_t_conflict1 *psVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  sample_t_conflict1 *psVar15;
  byte bVar16;
  undefined2 uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int (*paiVar22) [2];
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint8_t *puVar32;
  voice_t *pvVar33;
  sample_t_conflict1 sVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  uint uVar38;
  voice_t *pvVar39;
  int iVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  short sVar44;
  env_mode_t eVar45;
  bool bVar46;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  
  uVar23 = clock_count + (this->m).phase;
  (this->m).phase = uVar23 & 0x1f;
  if (0x1f < uVar23) {
    iVar24 = (int)uVar23 >> 5;
    puVar9 = (this->m).ram;
    bVar2 = (this->m).regs[0x5d];
    bVar3 = (this->m).regs[0x2d];
    bVar4 = (this->m).regs[0x3d];
    uVar23 = (this->m).regs[0x6c] & 0x1f;
    iVar12 = (int)(char)(this->m).regs[0xc];
    iVar18 = (int)(char)(this->m).regs[0x1c];
    iVar29 = -iVar12;
    if ((this->m).surround_threshold <= iVar18 * iVar12) {
      iVar29 = iVar12;
    }
    uVar8 = counter_mask[uVar23];
    do {
      uVar13 = (this->m).every_other_sample;
      (this->m).every_other_sample = uVar13 ^ 1;
      if (uVar13 != 1) {
        uVar13 = ~(this->m).kon & (this->m).new_kon;
        (this->m).new_kon = uVar13;
        (this->m).kon = uVar13;
        (this->m).t_koff = (uint)(this->m).regs[0x5c];
      }
      uVar13 = (this->m).counters[1];
      uVar14 = (this->m).counters[2];
      *(ulong *)((this->m).counters + 1) =
           CONCAT44((uVar14 - 1) + (-(uint)((uVar14 & 7) == 0) & 0xfffffffc),
                    (uVar13 - 1) + (-(uint)((uVar13 & 7) == 0) & 0xfffffffb));
      uVar13 = (this->m).counters[3];
      (this->m).counters[3] = (uVar13 - 4) + (uint)((uVar13 & 7) != 0) * 3;
      if ((*(this->m).counter_select[uVar23] & uVar8) == 0) {
        iVar12 = (this->m).noise;
        (this->m).noise = iVar12 >> 1 ^ (iVar12 << 0xe ^ iVar12 << 0xd) & 0x4000U;
      }
      local_94 = 0;
      uVar13 = 1;
      local_98 = 0;
      local_8c = 0;
      local_90 = 0;
      uVar14 = 0;
      puVar32 = (uint8_t *)this;
      pvVar33 = (this->m).voices;
      do {
        uVar37 = (uint)puVar9[pvVar33->brr_addr];
        if (pvVar33->kon_delay < 1) {
          iVar12 = (int)(((int)uVar14 >> 5) * (*(ushort *)(puVar32 + 2) & 0x3fff)) >> 10;
          if (((this->m).regs[0x2d] & uVar13) == 0) {
            iVar12 = 0;
          }
          iVar12 = iVar12 + (*(ushort *)(puVar32 + 2) & 0x3fff);
          uVar19 = pvVar33->env;
          puVar32[8] = (uint8_t)(uVar19 >> 4);
          if (uVar19 == 0) goto LAB_0057200f;
          uVar42 = (ulong)((uint)pvVar33->interp_pos >> 3 & 0x1fe);
          piVar10 = pvVar33->buf_pos;
          uVar43 = (ulong)((uint)pvVar33->interp_pos >> 0xc);
          if (((byte)(bVar4 | bVar3 >> 1) & uVar13) == 0) {
            uVar14 = (int)(((int)interleved_gauss[0x1fe - uVar42] * piVar10[uVar43 + 3] +
                            (int)interleved_gauss[0x1ff - uVar42] * piVar10[uVar43 + 2] +
                            (int)interleved_gauss[uVar42 + 1] * piVar10[uVar43 + 1] +
                            (int)interleved_gauss[uVar42] * piVar10[uVar43] >> 0xb) * uVar19) >> 0xb
            ;
          }
          else {
            if ((uVar13 & (this->m).regs[0x3d]) == 0) {
              uVar14 = ((int)interleved_gauss[0x1fe - uVar42] * piVar10[uVar43 + 3] >> 0xb) +
                       (int)(short)((short)((uint)((int)interleved_gauss[0x1ff - uVar42] *
                                                  piVar10[uVar43 + 2]) >> 0xb) +
                                   (short)((uint)((int)interleved_gauss[uVar42 + 1] *
                                                 piVar10[uVar43 + 1]) >> 0xb) +
                                   (short)((uint)((int)interleved_gauss[uVar42] * piVar10[uVar43])
                                          >> 0xb));
              if ((int)uVar14 < -0x7fff) {
                uVar14 = 0xffff8000;
              }
              if (0x7ffe < (int)uVar14) {
                uVar14 = 0x7fff;
              }
              uVar14 = uVar14 & 0xfffffffe;
            }
            else {
              uVar14 = (uint)(short)((short)(this->m).noise * 2);
            }
            uVar14 = (int)(uVar14 * uVar19) >> 0xb & 0xfffffffe;
          }
          iVar40 = pvVar33->volume[0] * uVar14;
          iVar21 = pvVar33->volume[1] * uVar14;
          local_90 = local_90 + iVar40;
          local_8c = local_8c + iVar21;
          if (((this->m).regs[0x4d] & uVar13) == 0) {
            iVar40 = 0;
            iVar21 = 0;
          }
          local_94 = local_94 + iVar21;
          local_98 = local_98 + iVar40;
        }
        else {
          uVar14 = pvVar33->kon_delay - 1;
          pvVar33->kon_delay = uVar14;
          if (uVar14 == 4) {
            pvVar33->brr_addr =
                 (uint)*(ushort *)(puVar9 + (ulong)puVar32[4] * 4 + (ulong)bVar2 * 0x100);
            pvVar33->brr_offset = 1;
            pvVar33->buf_pos = pvVar33->buf;
            uVar37 = 0;
          }
          pvVar33->env = 0;
          pvVar33->hidden_env = 0;
          pvVar33->interp_pos = (uint)((uVar14 & 3) != 0) << 0xe;
          puVar32[8] = '\0';
          iVar12 = 0;
LAB_0057200f:
          uVar19 = 0;
          uVar14 = 0;
        }
        puVar32[9] = (uint8_t)(uVar14 >> 8);
        if (((char)(this->m).regs[0x6c] < '\0') || ((uVar37 & 3) == 1)) {
          pvVar33->env_mode = env_release;
          uVar19 = 0;
        }
        if ((this->m).every_other_sample != 0) {
          if (((this->m).t_koff & uVar13) != 0) {
            pvVar33->env_mode = env_release;
          }
          if (((this->m).kon & uVar13) != 0) {
            pvVar33->kon_delay = 5;
            pvVar33->env_mode = env_attack;
            puVar1 = (this->m).regs + 0x7c;
            *puVar1 = *puVar1 & ~(byte)uVar13;
          }
        }
        if (pvVar33->kon_delay == 0) {
          eVar45 = pvVar33->env_mode;
          if (eVar45 != env_release) {
            bVar16 = puVar32[5];
            if ((char)bVar16 < '\0') {
              uVar38 = (uint)puVar32[6];
              if ((int)eVar45 < 3) {
                if (eVar45 == env_decay) {
                  uVar20 = (uVar19 - 1) - ((int)(uVar19 - 1) >> 8);
                  uVar43 = (ulong)(bVar16 >> 3 & 0xfffffffe);
                }
                else {
                  uVar41 = (uint)bVar16 * 2 & 0x1e;
                  uVar20 = uVar19 + 0x400;
                  if (uVar41 != 0x1e) {
                    uVar20 = uVar19 + 0x20;
                  }
                  uVar43 = (ulong)(uVar41 + 1);
                }
                goto LAB_00572496;
              }
              uVar20 = (uVar19 - 1) - ((int)(uVar19 - 1) >> 8);
              pvVar33->hidden_env = uVar20;
              uVar19 = *(this->m).counter_select[uVar38 & 0x1f] & counter_mask[uVar38 & 0x1f];
            }
            else {
              bVar16 = puVar32[7];
              uVar38 = (uint)bVar16;
              if ((char)bVar16 < '\0') {
                uVar43 = (ulong)(uVar38 & 0x1f);
                if (bVar16 >> 5 == 4) {
                  uVar20 = uVar19 - 0x20;
                }
                else if (bVar16 < 0xc0) {
                  uVar20 = (uVar19 - 1) - ((int)(uVar19 - 1) >> 8);
                }
                else {
                  uVar20 = uVar19 + 0x20;
                  if ((bVar16 >> 5 == 7) && (0x5ff < (uint)pvVar33->hidden_env)) {
                    uVar20 = uVar19 + 8;
                  }
                }
              }
              else {
                uVar43 = 0x1f;
                uVar20 = uVar38 << 4;
              }
LAB_00572496:
              if ((eVar45 == env_decay) && ((int)uVar20 >> 8 == uVar38 >> 5)) {
                pvVar33->env_mode = env_sustain;
                eVar45 = env_sustain;
              }
              pvVar33->hidden_env = uVar20;
              if (0x7ff < uVar20) {
                bVar46 = (int)uVar20 < 0;
                uVar20 = 0x7ff;
                if (bVar46) {
                  uVar20 = 0;
                }
                if (eVar45 == env_attack) {
                  pvVar33->env_mode = env_decay;
                }
              }
              uVar19 = *(this->m).counter_select[uVar43] & counter_mask[uVar43];
            }
            if (uVar19 == 0) {
              pvVar33->env = uVar20;
            }
            goto LAB_005721ea;
          }
          pvVar33->env = uVar19 - 8;
          if (8 < (int)uVar19) goto LAB_005721ea;
          pvVar33->env = 0;
        }
        else {
LAB_005721ea:
          uVar19 = pvVar33->interp_pos;
          iVar12 = (uVar19 & 0x3fff) + iVar12;
          if (0x7ffe < iVar12) {
            iVar12 = 0x7fff;
          }
          pvVar33->interp_pos = iVar12;
          if (0x3fff < (int)uVar19) {
            iVar12 = pvVar33->brr_addr;
            iVar40 = pvVar33->brr_offset;
            uVar5 = puVar9[iVar40 + iVar12 & 0xffff];
            uVar6 = puVar9[iVar40 + iVar12 + 1U & 0xffff];
            if (iVar40 < 7) {
              iVar40 = iVar40 + 2;
            }
            else {
              if ((uVar37 & 1) == 0) {
                uVar19 = iVar12 + 9U & 0xffff;
              }
              else {
                uVar19 = (uint)*(ushort *)
                                (puVar9 + (ulong)puVar32[4] * 4 + (ulong)bVar2 * 0x100 + 2);
                if (pvVar33->kon_delay == 0) {
                  puVar1 = (this->m).regs + 0x7c;
                  *puVar1 = *puVar1 | (byte)uVar13;
                }
              }
              pvVar33->brr_addr = uVar19;
              iVar40 = 1;
            }
            sVar44 = CONCAT11(uVar5,uVar6);
            pvVar33->brr_offset = iVar40;
            bVar16 = "\r\f\f\f\f\f\f\f\f\f\f\f\f\x10\x10\x10"[uVar37 >> 4];
            bVar7 = "\r\f\f\f\f\f\f\f\f\f\f\f\f\x10\x10\x10"[(ulong)(uVar37 >> 4) + 0x10];
            piVar10 = pvVar33->buf_pos;
            uVar37 = uVar37 & 0xc;
            for (uVar43 = 0; uVar43 < 0x10; uVar43 = uVar43 + 4) {
              iVar40 = ((int)sVar44 >> (bVar16 & 0x1f)) << (bVar7 & 0x1f);
              iVar12 = *(int *)((long)piVar10 + uVar43 + 0x2c);
              if (uVar37 < 8) {
                if (uVar37 != 0) {
                  iVar40 = (-iVar12 >> 5) + (iVar12 >> 1) + iVar40;
                }
              }
              else {
                iVar21 = *(int *)((long)piVar10 + uVar43 + 0x28);
                iVar25 = iVar21 >> 1;
                iVar40 = (iVar40 + iVar12) - iVar25;
                if (uVar37 == 8) {
                  iVar12 = (iVar12 * -3 >> 6) + (iVar21 >> 5);
                }
                else {
                  iVar40 = iVar40 + (iVar12 * -0xd >> 7);
                  iVar12 = iVar25 * 3 >> 4;
                }
                iVar40 = iVar40 + iVar12;
              }
              if (iVar40 < -0x7fff) {
                iVar40 = -0x8000;
              }
              if (0x7ffe < iVar40) {
                iVar40 = 0x7fff;
              }
              iVar12 = (int)(short)((short)iVar40 * 2);
              *(int *)((long)piVar10 + uVar43) = iVar12;
              *(int *)((long)piVar10 + uVar43 + 0x30) = iVar12;
              sVar44 = sVar44 << 4;
            }
            pvVar39 = (voice_t *)((long)piVar10 + uVar43);
            if (pvVar33->buf + 0xc <= (voice_t *)((long)piVar10 + uVar43)) {
              pvVar39 = pvVar33;
            }
            pvVar33->buf_pos = pvVar39->buf;
          }
        }
        uVar13 = uVar13 * 2;
        puVar32 = puVar32 + 0x10;
        pvVar33 = pvVar33 + 1;
      } while ((int)uVar13 < 0x100);
      iVar12 = (this->m).echo_offset;
      bVar16 = (this->m).regs[0x6d];
      if (iVar12 == 0) {
        iVar40 = ((this->m).regs[0x7d] & 0xf) << 0xb;
        (this->m).echo_length = iVar40;
      }
      else {
        iVar40 = (this->m).echo_length;
      }
      iVar21 = iVar12 + 4;
      if (iVar40 <= iVar21) {
        iVar21 = 0;
      }
      uVar43 = (ulong)((uint)bVar16 * 0x100 + iVar12 & 0xffff);
      (this->m).echo_offset = iVar21;
      iVar12 = (int)*(short *)(puVar9 + uVar43);
      paiVar22 = (this->m).echo_hist_pos + 1;
      if ((this->m).echo_hist + 8 <= paiVar22) {
        paiVar22 = (this->m).echo_hist;
      }
      iVar25 = (int)*(short *)(puVar9 + uVar43 + 2);
      (this->m).echo_hist_pos = paiVar22;
      paiVar22[8][0] = iVar12;
      (*paiVar22)[0] = iVar12;
      paiVar22[8][1] = iVar25;
      (*paiVar22)[1] = iVar25;
      iVar30 = (int)(char)(this->m).regs[0x7f];
      iVar26 = (int)(char)(this->m).regs[0xf];
      iVar35 = (int)(char)(this->m).regs[0x1f];
      iVar40 = (int)(char)(this->m).regs[0x2f];
      iVar27 = (int)(char)(this->m).regs[0x3f];
      iVar36 = (int)(char)(this->m).regs[0x4f];
      iVar28 = (int)(char)(this->m).regs[0x5f];
      iVar21 = (int)(char)(this->m).regs[0x6f];
      iVar31 = paiVar22[7][0] * iVar21 +
               paiVar22[6][0] * iVar28 + paiVar22[5][0] * iVar36 + paiVar22[4][0] * iVar27 +
               paiVar22[3][0] * iVar40 + paiVar22[2][0] * iVar35 +
               paiVar22[1][0] * iVar26 + iVar12 * iVar30;
      iVar12 = iVar21 * paiVar22[7][1] +
               iVar28 * paiVar22[6][1] + iVar36 * paiVar22[5][1] + iVar27 * paiVar22[4][1] +
               iVar40 * paiVar22[3][1] + iVar35 * paiVar22[2][1] +
               iVar26 * paiVar22[1][1] + iVar30 * iVar25;
      bVar16 = (this->m).regs[0x6c];
      if ((bVar16 & 0x20) == 0) {
        iVar40 = (int)(char)(this->m).regs[0xd];
        iVar21 = (iVar31 * iVar40 >> 0xe) + (local_98 >> 7);
        iVar40 = (iVar40 * iVar12 >> 0xe) + (local_94 >> 7);
        if (iVar21 < -0x7fff) {
          iVar21 = -0x8000;
        }
        if (0x7ffe < iVar21) {
          iVar21 = 0x7fff;
        }
        if (iVar40 < -0x7fff) {
          iVar40 = -0x8000;
        }
        uVar17 = (undefined2)iVar40;
        if (0x7ffe < iVar40) {
          uVar17 = 0x7fff;
        }
        puVar9[uVar43 + 1] = (uint8_t)((uint)iVar21 >> 8);
        puVar9[uVar43] = (uint8_t)iVar21;
        puVar9[uVar43 + 3] = (uint8_t)((ushort)uVar17 >> 8);
        puVar9[uVar43 + 2] = (uint8_t)uVar17;
        bVar16 = (this->m).regs[0x6c];
      }
      iVar26 = iVar31 * (char)(this->m).regs[0x2c] + local_90 * iVar29;
      iVar40 = iVar26 >> 0xe;
      iVar21 = iVar12 * (char)(this->m).regs[0x3c] + local_8c * iVar18;
      iVar25 = iVar21 >> 0xe;
      iVar12 = (iVar26 < 0) + 0x7fff;
      if ((short)iVar40 == iVar40) {
        iVar12 = iVar40;
      }
      sVar34 = (sample_t_conflict1)iVar12;
      iVar12 = (iVar21 < 0) + 0x7fff;
      if ((short)iVar25 == iVar25) {
        iVar12 = iVar25;
      }
      bVar46 = (bVar16 & 0x40) != 0;
      if (bVar46) {
        sVar34 = 0;
      }
      psVar11 = (this->m).out;
      *psVar11 = sVar34;
      sVar34 = (sample_t_conflict1)iVar12;
      if (bVar46) {
        sVar34 = 0;
      }
      psVar11[1] = sVar34;
      psVar15 = psVar11 + 2;
      if ((this->m).out_end <= psVar11 + 2) {
        (this->m).out_end = (sample_t_conflict1 *)(this + 1);
        psVar15 = (this->m).extra;
      }
      (this->m).out = psVar15;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
  }
  return;
}

Assistant:

void Spc_Dsp::run( int clock_count )
{
	int new_phase = m.phase + clock_count;
	int count = new_phase >> 5;
	m.phase = new_phase & 31;
	if ( !count )
		return;
	
	uint8_t* const ram = m.ram;
	uint8_t const* const dir = &ram [REG(dir) * 0x100];
	int const slow_gaussian = (REG(pmon) >> 1) | REG(non);
	int const noise_rate = REG(flg) & 0x1F;
	
	// Global volume
	int mvoll = (int8_t) REG(mvoll);
	int mvolr = (int8_t) REG(mvolr);
	if ( mvoll * mvolr < m.surround_threshold )
		mvoll = -mvoll; // eliminate surround
	
	do
	{
		// KON/KOFF reading
		if ( (m.every_other_sample ^= 1) != 0 )
		{
			m.new_kon &= ~m.kon;
			m.kon    = m.new_kon;
			m.t_koff = REG(koff); 
		}
		
		run_counter( 1 );
		run_counter( 2 );
		run_counter( 3 );
		
		// Noise
		if ( !READ_COUNTER( noise_rate ) )
		{
			int feedback = (m.noise << 13) ^ (m.noise << 14);
			m.noise = (feedback & 0x4000) ^ (m.noise >> 1);
		}
		
		// Voices
		int pmon_input = 0;
		int main_out_l = 0;
		int main_out_r = 0;
		int echo_out_l = 0;
		int echo_out_r = 0;
		voice_t* v = m.voices;
		uint8_t* v_regs = m.regs;
		int vbit = 1;
		do
		{
			#define SAMPLE_PTR(i) GET_LE16A( &dir [VREG(v_regs,srcn) * 4 + i * 2] )
			
			int brr_header = ram [v->brr_addr];
			int kon_delay = v->kon_delay;
			
			// Pitch
			int pitch = GET_LE16A( &VREG(v_regs,pitchl) ) & 0x3FFF;
			if ( REG(pmon) & vbit )
				pitch += ((pmon_input >> 5) * pitch) >> 10;
			
			// KON phases
			if ( --kon_delay >= 0 )
			{
				v->kon_delay = kon_delay;
				
				// Get ready to start BRR decoding on next sample
				if ( kon_delay == 4 )
				{
					v->brr_addr   = SAMPLE_PTR( 0 );
					v->brr_offset = 1;
					v->buf_pos    = v->buf;
					brr_header    = 0; // header is ignored on this sample
				}
				
				// Envelope is never run during KON
				v->env        = 0;
				v->hidden_env = 0;
				
				// Disable BRR decoding until last three samples
				v->interp_pos = (kon_delay & 3 ? 0x4000 : 0);
				
				// Pitch is never added during KON
				pitch = 0;
			}
			
			int env = v->env;
			
			// Gaussian interpolation
			{
				int output = 0;
				VREG(v_regs,envx) = (uint8_t) (env >> 4);
				if ( env )
				{
					// Make pointers into gaussian based on fractional position between samples
					int offset = (unsigned) v->interp_pos >> 3 & 0x1FE;
					short const* fwd = interleved_gauss       + offset;
					short const* rev = interleved_gauss + 510 - offset; // mirror left half of gaussian
					
					int const* in = &v->buf_pos [(unsigned) v->interp_pos >> 12];
					
					if ( !(slow_gaussian & vbit) ) // 99%
					{
						// Faster approximation when exact sample value isn't necessary for pitch mod
						output = (fwd [0] * in [0] +
						          fwd [1] * in [1] +
						          rev [1] * in [2] +
						          rev [0] * in [3]) >> 11;
						output = (output * env) >> 11;
					}
					else
					{
						output = (int16_t) (m.noise * 2);
						if ( !(REG(non) & vbit) )
						{
							output  = (fwd [0] * in [0]) >> 11;
							output += (fwd [1] * in [1]) >> 11;
							output += (rev [1] * in [2]) >> 11;
							output = (int16_t) output;
							output += (rev [0] * in [3]) >> 11;
							
							CLAMP16( output );
							output &= ~1;
						}
						output = (output * env) >> 11 & ~1;
					}
					
					// Output
					int l = output * v->volume [0];
					int r = output * v->volume [1];
					
					main_out_l += l;
					main_out_r += r;
					
					if ( REG(eon) & vbit )
					{
						echo_out_l += l;
						echo_out_r += r;
					}
				}
				
				pmon_input = output;
				VREG(v_regs,outx) = (uint8_t) (output >> 8);
			}
			
			// Soft reset or end of sample
			if ( REG(flg) & 0x80 || (brr_header & 3) == 1 )
			{
				v->env_mode = env_release;
				env         = 0;
			}
			
			if ( m.every_other_sample )
			{
				// KOFF
				if ( m.t_koff & vbit )
					v->env_mode = env_release;
				
				// KON
				if ( m.kon & vbit )
				{
					v->kon_delay = 5;
					v->env_mode  = env_attack;
					REG(endx) &= ~vbit;
				}
			}
			
			// Envelope
			if ( !v->kon_delay )
			{
				if ( v->env_mode == env_release ) // 97%
				{
					env -= 0x8;
					v->env = env;
					if ( env <= 0 )
					{
						v->env = 0;
						goto skip_brr; // no BRR decoding for you!
					}
				}
				else // 3%
				{
					int rate;
					int const adsr0 = VREG(v_regs,adsr0);
					int env_data = VREG(v_regs,adsr1);
					if ( adsr0 >= 0x80 ) // 97% ADSR
					{
						if ( v->env_mode > env_decay ) // 89%
						{
							env--;
							env -= env >> 8;
							rate = env_data & 0x1F;
							
							// optimized handling
							v->hidden_env = env;
							if ( READ_COUNTER( rate ) )
								goto exit_env;
							v->env = env;
							goto exit_env;
						}
						else if ( v->env_mode == env_decay )
						{
							env--;
							env -= env >> 8;
							rate = (adsr0 >> 3 & 0x0E) + 0x10;
						}
						else // env_attack
						{
							rate = (adsr0 & 0x0F) * 2 + 1;
							env += rate < 31 ? 0x20 : 0x400;
						}
					}
					else // GAIN
					{
						int mode;
						env_data = VREG(v_regs,gain);
						mode = env_data >> 5;
						if ( mode < 4 ) // direct
						{
							env = env_data * 0x10;
							rate = 31;
						}
						else
						{
							rate = env_data & 0x1F;
							if ( mode == 4 ) // 4: linear decrease
							{
								env -= 0x20;
							}
							else if ( mode < 6 ) // 5: exponential decrease
							{
								env--;
								env -= env >> 8;
							}
							else // 6,7: linear increase
							{
								env += 0x20;
								if ( mode > 6 && (unsigned) v->hidden_env >= 0x600 )
									env += 0x8 - 0x20; // 7: two-slope linear increase
							}
						}
					}
					
					// Sustain level
					if ( (env >> 8) == (env_data >> 5) && v->env_mode == env_decay )
						v->env_mode = env_sustain;
					
					v->hidden_env = env;
					
					// unsigned cast because linear decrease going negative also triggers this
					if ( (unsigned) env > 0x7FF )
					{
						env = (env < 0 ? 0 : 0x7FF);
						if ( v->env_mode == env_attack )
							v->env_mode = env_decay;
					}
					
					if ( !READ_COUNTER( rate ) )
						v->env = env; // nothing else is controlled by the counter
				}
			}
		exit_env:
			
			{
				// Apply pitch
				int old_pos = v->interp_pos;
				int interp_pos = (old_pos & 0x3FFF) + pitch;
				if ( interp_pos > 0x7FFF )
					interp_pos = 0x7FFF;
				v->interp_pos = interp_pos;
				
				// BRR decode if necessary
				if ( old_pos >= 0x4000 )
				{
					// Arrange the four input nybbles in 0xABCD order for easy decoding
					int nybbles = ram [(v->brr_addr + v->brr_offset) & 0xFFFF] * 0x100 +
							ram [(v->brr_addr + v->brr_offset + 1) & 0xFFFF];
					
					// Advance read position
					int const brr_block_size = 9;
					int brr_offset = v->brr_offset;
					if ( (brr_offset += 2) >= brr_block_size )
					{
						// Next BRR block
						int brr_addr = (v->brr_addr + brr_block_size) & 0xFFFF;
						assert( brr_offset == brr_block_size );
						if ( brr_header & 1 )
						{
							brr_addr = SAMPLE_PTR( 1 );
							if ( !v->kon_delay )
								REG(endx) |= vbit;
						}
						v->brr_addr = brr_addr;
						brr_offset  = 1;
					}
					v->brr_offset = brr_offset;
					
					// Decode
					
					// 0: >>1  1: <<0  2: <<1 ... 12: <<11  13-15: >>4 <<11
					static unsigned char const shifts [16 * 2] = {
						13,12,12,12,12,12,12,12,12,12,12, 12, 12, 16, 16, 16,
						 0, 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 11, 11, 11
					};
					int const scale = brr_header >> 4;
					int const right_shift = shifts [scale];
					int const left_shift  = shifts [scale + 16];
					
					// Write to next four samples in circular buffer
					int* pos = v->buf_pos;
					int* end;
					
					// Decode four samples
					for ( end = pos + 4; pos < end; pos++, nybbles <<= 4 )
					{
						// Extract upper nybble and scale appropriately
						int s = ((int16_t) nybbles >> right_shift) << left_shift;
						
						// Apply IIR filter (8 is the most commonly used)
						int const filter = brr_header & 0x0C;
						int const p1 = pos [brr_buf_size - 1];
						int const p2 = pos [brr_buf_size - 2] >> 1;
						if ( filter >= 8 )
						{
							s += p1;
							s -= p2;
							if ( filter == 8 ) // s += p1 * 0.953125 - p2 * 0.46875
							{
								s += p2 >> 4;
								s += (p1 * -3) >> 6;
							}
							else // s += p1 * 0.8984375 - p2 * 0.40625
							{
								s += (p1 * -13) >> 7;
								s += (p2 * 3) >> 4;
							}
						}
						else if ( filter ) // s += p1 * 0.46875
						{
							s += p1 >> 1;
							s += (-p1) >> 5;
						}
						
						// Adjust and write sample
						CLAMP16( s );
						s = (int16_t) (s * 2);
						pos [brr_buf_size] = pos [0] = s; // second copy simplifies wrap-around
					}
					
					if ( pos >= &v->buf [brr_buf_size] )
						pos = v->buf;
					v->buf_pos = pos;
				}
			}
skip_brr:
			// Next voice
			vbit <<= 1;
			v_regs += 0x10;
			v++;
		}
		while ( vbit < 0x100 );
		
		// Echo position
		int echo_offset = m.echo_offset;
		uint8_t* const echo_ptr = &ram [(REG(esa) * 0x100 + echo_offset) & 0xFFFF];
		if ( !echo_offset )
			m.echo_length = (REG(edl) & 0x0F) * 0x800;
		echo_offset += 4;
		if ( echo_offset >= m.echo_length )
			echo_offset = 0;
		m.echo_offset = echo_offset;
		
		// FIR
		int echo_in_l = GET_LE16SA( echo_ptr + 0 );
		int echo_in_r = GET_LE16SA( echo_ptr + 2 );
		
		int (*echo_hist_pos) [2] = m.echo_hist_pos;
		if ( ++echo_hist_pos >= &m.echo_hist [echo_hist_size] )
			echo_hist_pos = m.echo_hist;
		m.echo_hist_pos = echo_hist_pos;
		
		echo_hist_pos [0] [0] = echo_hist_pos [8] [0] = echo_in_l;
		echo_hist_pos [0] [1] = echo_hist_pos [8] [1] = echo_in_r;
		
		#define CALC_FIR_( i, in )  ((in) * (int8_t) REG(fir + i * 0x10))
		echo_in_l = CALC_FIR_( 7, echo_in_l );
		echo_in_r = CALC_FIR_( 7, echo_in_r );
		
		#define CALC_FIR( i, ch )   CALC_FIR_( i, echo_hist_pos [i + 1] [ch] )
		#define DO_FIR( i )\
			echo_in_l += CALC_FIR( i, 0 );\
			echo_in_r += CALC_FIR( i, 1 );
		DO_FIR( 0 );
		DO_FIR( 1 );
		DO_FIR( 2 );
		#if defined (__MWERKS__) && __MWERKS__ < 0x3200
			__eieio(); // keeps compiler from stupidly "caching" things in memory
		#endif
		DO_FIR( 3 );
		DO_FIR( 4 );
		DO_FIR( 5 );
		DO_FIR( 6 );
		
		// Echo out
		if ( !(REG(flg) & 0x20) )
		{
			int l = (echo_out_l >> 7) + ((echo_in_l * (int8_t) REG(efb)) >> 14);
			int r = (echo_out_r >> 7) + ((echo_in_r * (int8_t) REG(efb)) >> 14);
			
			// just to help pass more validation tests
			#if SPC_MORE_ACCURACY
				l &= ~1;
				r &= ~1;
			#endif
			
			CLAMP16( l );
			CLAMP16( r );
			
			SET_LE16A( echo_ptr + 0, l );
			SET_LE16A( echo_ptr + 2, r );
		}
		
		// Sound out
		int l = (main_out_l * mvoll + echo_in_l * (int8_t) REG(evoll)) >> 14;
		int r = (main_out_r * mvolr + echo_in_r * (int8_t) REG(evolr)) >> 14;
		
		CLAMP16( l );
		CLAMP16( r );
		
		if ( (REG(flg) & 0x40) )
		{
			l = 0;
			r = 0;
		}
		
		sample_t* out = m.out;
		WRITE_SAMPLES( l, r, out );
		m.out = out;
	}
	while ( --count );
}